

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalctocsv.cpp
# Opt level: O3

void doit(bool skipheader,bool fullprecision,bool show_exposure_value,
         bool remove_zero_exposure_records,bool ord_output,bool all_idx,bool parquet_output,
         string *parquetOutFile)

{
  pointer pcVar1;
  string parquetOutFile_00;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  undefined7 in_register_00000009;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  undefined4 uVar12;
  int summary_set;
  summarySampleslevelHeader sh;
  int samplesize;
  int summarycalcstream_type;
  undefined1 in_stack_ffffffffffffff48 [12];
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  uint uVar13;
  float in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 local_98;
  uint local_94;
  uint local_90;
  float local_8c;
  double local_88;
  undefined4 local_80;
  uint local_7c;
  undefined1 local_78 [16];
  timespec local_60;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if ((int)CONCAT71(in_register_00000009,remove_zero_exposure_records) != 0) {
    pcVar1 = (parquetOutFile->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + parquetOutFile->_M_string_length);
    parquetOutFile_00._M_string_length._4_4_ = in_stack_ffffffffffffff54;
    parquetOutFile_00._0_12_ = in_stack_ffffffffffffff48;
    parquetOutFile_00.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffff58;
    parquetOutFile_00.field_2._M_allocated_capacity._4_4_ = in_stack_ffffffffffffff5c;
    parquetOutFile_00.field_2._8_4_ = in_stack_ffffffffffffff60;
    parquetOutFile_00.field_2._12_4_ = in_stack_ffffffffffffff64;
    doitz(skipheader,fullprecision,show_exposure_value,ord_output,all_idx,parquet_output,
          parquetOutFile_00);
    if (local_50[0] == local_40) {
      return;
    }
    operator_delete(local_50[0]);
    return;
  }
  local_7c = 0;
  fread(&local_7c,4,1,_stdin);
  if ((~local_7c & 0x3000000) != 0) {
    std::operator<<((ostream *)&std::cerr,"FATAL: Not a summarycalc stream type\n");
    exit(-1);
  }
  if ((local_7c & 0xffffff) != 1) {
    doit();
    return;
  }
  if (!skipheader) {
    if (ord_output) {
      pcVar7 = "EventId,SummaryId,SampleId,Loss,ImpactedExposure";
    }
    else {
      if (parquet_output) goto LAB_001017f4;
      pcVar7 = "event_id,summary_id,sidx,loss";
      if (show_exposure_value) {
        pcVar7 = "event_id,exposure_value,summary_id,sidx,loss";
      }
    }
    puts(pcVar7);
  }
LAB_001017f4:
  uVar9 = (uint)fullprecision;
  uVar8 = (uint)show_exposure_value;
  uVar10 = (uint)ord_output;
  local_80 = 0;
  local_98 = 0;
  sVar5 = fread(&local_80,4,1,_stdin);
  if (((sVar5 != 0) && (sVar5 = fread(&local_98,4,1,_stdin), sVar5 != 0)) &&
     (sVar5 = fread(&local_94,0xc,1,_stdin), sVar5 != 0)) {
    do {
      sVar5 = fread(&stack0xffffffffffffff5c,8,1,_stdin);
      uVar3 = local_90;
      uVar2 = local_94;
      if (sVar5 == 0) {
        return;
      }
      local_78 = ZEXT416((uint)local_8c);
      local_88 = (double)local_8c;
      uVar13 = in_stack_ffffffffffffff5c;
      do {
        in_stack_ffffffffffffff5c = uVar13;
        if (in_stack_ffffffffffffff5c == 0) goto LAB_00101a52;
        uVar13 = in_stack_ffffffffffffff5c;
        if (in_stack_ffffffffffffff5c != 0xfffffffb || all_idx) {
          rowcount = rowcount + 1;
          if ((char)uVar9 == '\0') {
            if ((char)uVar10 != '\0') {
              uVar12 = SUB84((double)in_stack_ffffffffffffff60,0);
              pcVar7 = "%d,%d,%d,%.2f,%.2f\n";
              goto LAB_00101940;
            }
            if (!parquet_output) {
              if ((char)uVar8 == '\0') {
                pcVar7 = "%d,%d,%d,%.2f\n";
                goto LAB_00101a27;
              }
              pcVar7 = "%d,%.2f,%d,%d,%.2f\n";
LAB_001019fd:
              printf(pcVar7,SUB84(local_88,0),(ulong)uVar2,(ulong)uVar3,
                     (ulong)in_stack_ffffffffffffff5c);
            }
          }
          else if ((char)uVar10 == '\0') {
            if (!parquet_output) {
              if ((char)uVar8 != '\0') {
                pcVar7 = "%d,%f,%d,%d,%f\n";
                goto LAB_001019fd;
              }
              pcVar7 = "%d,%d,%d,%f\n";
LAB_00101a27:
              printf(pcVar7,SUB84((double)in_stack_ffffffffffffff60,0),(ulong)uVar2,(ulong)uVar3,
                     (ulong)in_stack_ffffffffffffff5c);
            }
          }
          else {
            uVar12 = SUB84((double)in_stack_ffffffffffffff60,0);
            pcVar7 = "%d,%d,%d,%f,%f\n";
LAB_00101940:
            printf(pcVar7,uVar12,
                   (double)(float)(~-(uint)(in_stack_ffffffffffffff60 == 0.0) & local_78._0_4_),
                   (ulong)uVar2,(ulong)uVar3,(ulong)in_stack_ffffffffffffff5c);
          }
          if (firstOutput == true) {
            local_60.tv_sec = 1;
            local_60.tv_nsec = 0;
            do {
              iVar4 = nanosleep(&local_60,&local_60);
              if (iVar4 != -1) break;
              piVar6 = __errno_location();
            } while (*piVar6 == 4);
            firstOutput = false;
          }
        }
        sVar5 = fread(&stack0xffffffffffffff5c,8,1,_stdin);
      } while (sVar5 != 0);
      bVar11 = in_stack_ffffffffffffff5c != 0;
      in_stack_ffffffffffffff5c = uVar13;
      if (bVar11) {
        return;
      }
LAB_00101a52:
      sVar5 = fread(&local_94,0xc,1,_stdin);
    } while (sVar5 != 0);
  }
  return;
}

Assistant:

void doit(bool skipheader, bool fullprecision,bool show_exposure_value,
	  bool remove_zero_exposure_records, bool ord_output, bool all_idx,
	  bool parquet_output, std::string parquetOutFile)
{
	if (remove_zero_exposure_records == true) {
		doitz(skipheader, fullprecision, show_exposure_value, ord_output, all_idx, parquet_output, parquetOutFile);
		return;
	}
	int summarycalcstream_type = 0;
	size_t i = fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, stdin);
	int stream_type = summarycalcstream_type & summarycalc_id;

	if (stream_type != summarycalc_id) {
		std::cerr << "FATAL: Not a summarycalc stream type\n";
		exit(-1);
	}
	stream_type = streamno_mask & summarycalcstream_type;

	if (stream_type == 1 ){
		if (skipheader == false) {
			// ORD output flag takes priority over exposure value flag
			// ImpactedNumLocs not currently supported in ORD output
			if (ord_output == true) {
				printf("EventId,SummaryId,SampleId,Loss,ImpactedExposure\n");
			} else if (parquet_output == false) {
				if (show_exposure_value == true)
					printf("event_id,exposure_value,summary_id,sidx,loss\n");
				else printf("event_id,summary_id,sidx,loss\n");
			}
		}
#ifdef HAVE_PARQUET
		parquet::StreamWriter os;
		if (parquet_output == true)
			os = OasisParquet::GetParquetStreamWriter(OasisParquet::SELT,
								  parquetOutFile);
#endif
		int samplesize=0;
		int summary_set = 0;
		i=fread(&samplesize, sizeof(samplesize), 1, stdin);
		if( i != 0) i=fread(&summary_set, sizeof(samplesize), 1, stdin);
		while (i != 0){
			summarySampleslevelHeader sh;
			i = fread(&sh, sizeof(sh), 1, stdin);
			while (i != 0){
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, stdin);
				if (i == 0) break;	
				if (sr.sidx == 0) break;
				if (!all_idx && sr.sidx == max_loss_idx) {   // Only output MaxLoss if flag set
					continue;
				}
				rowcount++;
#ifdef HAVE_PARQUET
				if (parquet_output == true) {
					float impacted_exp = sh.expval;
					if (sr.loss == 0) impacted_exp = 0;
					os << sh.event_id << sh.summary_id
					   << sr.sidx << (float)sr.loss
					   << impacted_exp << parquet::EndRow;
				}
#endif
				if (fullprecision == true) {
					// ORD output flag takes priority over exposure value flag
					if (ord_output == true) {
						OASIS_FLOAT impacted_exp = sh.expval;
						if (sr.loss == 0) impacted_exp = 0;
						printf("%d,%d,%d,%f,%f\n", sh.event_id, sh.summary_id, sr.sidx, sr.loss, impacted_exp);
					} else if (parquet_output == false) {
						if (show_exposure_value == true) {
							printf("%d,%f,%d,%d,%f\n", sh.event_id, sh.expval, sh.summary_id, sr.sidx, sr.loss);
						} else {
							printf("%d,%d,%d,%f\n", sh.event_id, sh.summary_id, sr.sidx, sr.loss);
						}
					}
				} else {
					// ORD output flag takes priority over exposure value flag
					if (ord_output == true) {
						OASIS_FLOAT impacted_exp = sh.expval;
						if (sr.loss == 0) impacted_exp = 0;
						printf("%d,%d,%d,%.2f,%.2f\n", sh.event_id, sh.summary_id, sr.sidx, sr.loss, impacted_exp);
					} else if (parquet_output == false) {
						if (show_exposure_value == true) {
							printf("%d,%.2f,%d,%d,%.2f\n", sh.event_id, sh.expval, sh.summary_id, sr.sidx, sr.loss);
						} else {
							printf("%d,%d,%d,%.2f\n", sh.event_id, sh.summary_id, sr.sidx, sr.loss);
						}
					}
				}
				if (firstOutput==true){
					std::this_thread::sleep_for(std::chrono::milliseconds(PIPE_DELAY));  // used to stop possible race condition with kat
					firstOutput=false;
				} 				
			}
		}
		return;
	}
	fprintf(stderr,"FATAL: Unsupported summarycalc stream type\n");

}